

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<void> __thiscall
kj::Promise<void>::exclusiveJoin(Promise<void> *this,Promise<void> *other,SourceLocation location)

{
  PromiseBase PVar1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *in_RDX;
  PromiseBase local_20;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_18;
  
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
            ((PromiseDisposer *)&local_20,(OwnPromiseNode *)other,in_RDX,&location);
  PVar1.node.ptr = local_20.node.ptr;
  local_20.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)PVar1.node.ptr;
  local_18.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_18);
  Own<kj::_::ExclusiveJoinPromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::ExclusiveJoinPromiseNode,_kj::_::PromiseDisposer> *)&local_20);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::exclusiveJoin(Promise<T>&& other, SourceLocation location) {
  return Promise(false, _::PromiseDisposer::appendPromise<_::ExclusiveJoinPromiseNode>(
      kj::mv(node), kj::mv(other.node), location));
}